

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dieharder_file.cc
# Opt level: O1

void generate<trng::yarn3>(size_t samples,unsigned_long seed)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  ostream *poVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  parameter_type P;
  yarn3 r;
  char local_49;
  yarn3 local_48;
  
  P.a[2] = DAT_001701d8;
  P.a._0_8_ = trng::yarn3::LEcuyer1;
  trng::yarn3::yarn3(&local_48,P);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "#==================================================================\n",0x44);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"# generator ",0xc);
  __s = trng::yarn3::name();
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x3510d0);
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  seed = ",9);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"#==================================================================\n",0x44);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"type: d\n",8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"count: ",7);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"numbit: ",8);
  iVar1 = trng::int_math::log2_ceil<int>(0x7ffffffe);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
  local_49 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_49,1);
  if (samples != 0) {
    do {
      uVar6 = (long)local_48.S.r[2] * (long)local_48.P.a[2] +
              (long)local_48.P.a[1] * (long)local_48.S.r[1] +
              (long)local_48.P.a[0] * (long)local_48.S.r[0];
      uVar7 = (uVar6 >> 0x1f) + (uVar6 & 0x7fffffff);
      uVar6 = uVar7 - 0xfffffffe;
      if (uVar7 < 0xfffffffe) {
        uVar6 = uVar7;
      }
      local_48.S.r[2] = local_48.S.r[1];
      local_48.S.r[1] = local_48.S.r[0];
      local_48.S.r[0] = (uint)uVar6 + 0x80000001;
      if (uVar6 < 0x7fffffff) {
        local_48.S.r[0] = (uint)uVar6;
      }
      if (local_48.S.r[0] == 0) {
        uVar4 = 0;
      }
      else {
        uVar4 = (uint)((ulong)*(uint *)(trng::yarn3::g + (ulong)(local_48.S.r[0] & 0xffff) * 4) *
                      (ulong)*(uint *)(trng::yarn3::g +
                                      (long)(local_48.S.r[0] >> 0x10) * 4 + 0x40000)) & 0x7fffffff;
        iVar1 = (int)((ulong)*(uint *)(trng::yarn3::g + (ulong)(local_48.S.r[0] & 0xffff) * 4) *
                      (ulong)*(uint *)(trng::yarn3::g +
                                      (long)(local_48.S.r[0] >> 0x10) * 4 + 0x40000) >> 0x1f);
        uVar5 = uVar4 + iVar1;
        uVar4 = uVar4 + 0x80000001 + iVar1;
        if (uVar5 < 0x7fffffff) {
          uVar4 = uVar5;
        }
      }
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar4);
      local_49 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_49,1);
      samples = samples - 1;
    } while (samples != 0);
  }
  return;
}

Assistant:

void generate(std::size_t samples, unsigned long seed) {
  R r;
  std::cout << "#==================================================================\n"
            << "# generator " << r.name() << "  seed = " << seed << "\n"
            << "#==================================================================\n"
            << "type: d\n"
            << "count: " << samples << "\n"
            << "numbit: " << trng::int_math::log2_ceil(r.max() - r.min()) << '\n';
  for (std::size_t j{0}; j < samples; ++j)
    std::cout << r() - r.min() << '\n';
}